

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O1

bool __thiscall
crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::split_node
          (tree_clusterizer<crnlib::vec<16U,_float>_> *this,
          priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
          *node_queue,uint *end_node,task_pool *pTask_pool)

{
  vq_node *pvVar1;
  uint uVar2;
  pointer pNVar3;
  vq_node *pvVar4;
  VectorInfo *pVVar5;
  vec<16U,_float> *pvVar6;
  vq_node *pvVar7;
  double dVar8;
  int iVar9;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  *this_00;
  uint i_4;
  uint uVar10;
  int iVar11;
  int iVar12;
  ulong uVar13;
  executable_task *pObj;
  ulong uVar14;
  long lVar15;
  long lVar16;
  value_type *pvVar17;
  uint task;
  uint64 uVar18;
  ulong uVar19;
  uint uVar20;
  value_type *pvVar21;
  vec<16U,_float> *pvVar22;
  value_type **ppvVar23;
  vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo> *pvVar24;
  uint i_2;
  uint x;
  uint uVar25;
  uint i_16;
  long lVar26;
  vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo> *pvVar27;
  uint i_15;
  vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo> *pvVar28;
  uint uVar29;
  ulong uVar30;
  vq_node *pvVar31;
  ulong uVar32;
  float dist2;
  float fVar33;
  float fVar34;
  float fVar35;
  double sum;
  undefined1 auVar36 [16];
  float dist2_3;
  float fVar37;
  double dVar38;
  vec<16U,_float> axis;
  vec<16U,_float> new_left_child;
  vec<16U,_float> right_child;
  vec<16U,_float> left_child;
  vec<16U,_float> result_6;
  vec<16U,_float> furthest;
  vec<16U,_float> new_right_child;
  vec<16U,_float> opposite;
  vec<16U,_float> result;
  float local_69c;
  undefined8 local_678;
  undefined1 *puStack_670;
  undefined1 local_668 [16];
  undefined8 local_658;
  undefined8 uStack_650;
  undefined8 local_648;
  undefined8 uStack_640;
  value_type *local_638;
  undefined1 *puStack_630;
  uint local_628;
  uint uStack_624;
  uint uStack_620;
  undefined4 uStack_61c;
  undefined8 local_618;
  undefined8 uStack_610;
  undefined8 local_608;
  undefined8 uStack_600;
  vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo> *local_5f8;
  vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::VectorInfo> *local_5f0;
  ulong local_5e8;
  uint *local_5e0;
  priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
  *local_5d8;
  vq_node *local_5d0;
  undefined1 local_5c8 [20];
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  undefined1 local_5a8 [16];
  float local_598 [2];
  float afStack_590 [2];
  undefined1 local_588 [64];
  float local_548 [16];
  undefined1 local_508 [16];
  undefined8 local_4f8;
  undefined8 uStack_4f0;
  undefined1 local_4e8 [16];
  undefined8 local_4d8;
  undefined8 uStack_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  float local_4b8 [16];
  undefined8 local_478;
  undefined8 uStack_470;
  undefined1 local_468 [16];
  undefined8 local_458;
  undefined8 uStack_450;
  undefined8 local_448;
  undefined8 uStack_440;
  value_type local_438;
  float afStack_430 [256];
  
  pNVar3 = (node_queue->c).
           super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pNVar3 != (node_queue->c).
                super__Vector_base<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
                ._M_impl.super__Vector_impl_data._M_finish) {
    uVar25 = pNVar3->m_index;
    pvVar4 = (this->m_nodes).m_p;
    pvVar31 = pvVar4 + uVar25;
    if (pvVar4[uVar25].m_alternative == true) {
      pvVar31->m_alternative = false;
    }
    if ((0.0 < pvVar31->m_variance) && (pvVar31->m_begin + 1 != pvVar31->m_end)) {
      std::
      priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
      ::pop(node_queue);
      if (pvVar31->m_processed == true) {
        if (pvVar31->m_unsplittable != false) {
          return true;
        }
        uVar25 = pvVar31->m_left;
        pvVar4 = (this->m_nodes).m_p;
        uVar10 = *end_node;
        if (uVar10 != uVar25) {
          lVar15 = 0;
          do {
            pvVar4[uVar10].m_centroid.m_s[lVar15] = pvVar4[uVar25].m_centroid.m_s[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0x10);
        }
        *(undefined4 *)((long)&pvVar4[uVar10].m_codebook_index + 3) =
             *(undefined4 *)((long)&pvVar4[uVar25].m_codebook_index + 3);
        uVar18 = pvVar4[uVar25].m_total_weight;
        fVar34 = pvVar4[uVar25].m_variance;
        uVar2 = pvVar4[uVar25].m_begin;
        iVar11 = pvVar4[uVar25].m_left;
        iVar12 = pvVar4[uVar25].m_right;
        iVar9 = pvVar4[uVar25].m_codebook_index;
        pvVar4[uVar10].m_end = pvVar4[uVar25].m_end;
        pvVar4[uVar10].m_left = iVar11;
        pvVar4[uVar10].m_right = iVar12;
        pvVar4[uVar10].m_codebook_index = iVar9;
        pvVar4[uVar10].m_total_weight = uVar18;
        pvVar4[uVar10].m_variance = fVar34;
        pvVar4[uVar10].m_begin = uVar2;
        local_438.m_index = *end_node;
        pvVar4 = (this->m_nodes).m_p;
        pvVar4[local_438.m_index].m_alternative = true;
        local_438.m_variance = pvVar4[local_438.m_index].m_variance;
        std::
        priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
        ::push(node_queue,&local_438);
        uVar2 = *end_node;
        *end_node = uVar2 + 1;
        pvVar31->m_left = uVar2;
        uVar25 = pvVar31->m_right;
        pvVar4 = (this->m_nodes).m_p;
        uVar10 = *end_node;
        if (uVar10 != uVar25) {
          lVar15 = 0;
          do {
            pvVar4[uVar10].m_centroid.m_s[lVar15] = pvVar4[uVar25].m_centroid.m_s[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0x10);
        }
        *(undefined4 *)((long)&pvVar4[uVar10].m_codebook_index + 3) =
             *(undefined4 *)((long)&pvVar4[uVar25].m_codebook_index + 3);
        uVar18 = pvVar4[uVar25].m_total_weight;
        fVar34 = pvVar4[uVar25].m_variance;
        uVar2 = pvVar4[uVar25].m_begin;
        iVar11 = pvVar4[uVar25].m_left;
        iVar12 = pvVar4[uVar25].m_right;
        iVar9 = pvVar4[uVar25].m_codebook_index;
        pvVar4[uVar10].m_end = pvVar4[uVar25].m_end;
        pvVar4[uVar10].m_left = iVar11;
        pvVar4[uVar10].m_right = iVar12;
        pvVar4[uVar10].m_codebook_index = iVar9;
        pvVar4[uVar10].m_total_weight = uVar18;
        pvVar4[uVar10].m_variance = fVar34;
        pvVar4[uVar10].m_begin = uVar2;
        local_438.m_index = *end_node;
        pvVar4 = (this->m_nodes).m_p;
        pvVar4[local_438.m_index].m_alternative = true;
        local_438.m_variance = pvVar4[local_438.m_index].m_variance;
        std::
        priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
        ::push(node_queue,&local_438);
        uVar2 = *end_node;
        *end_node = uVar2 + 1;
        pvVar31->m_right = uVar2;
        return true;
      }
      pvVar31->m_processed = true;
      uVar25 = 1;
      if ((pTask_pool != (task_pool *)0x0) &&
         (uVar10 = pvVar31->m_end - pvVar31->m_begin, 0x3ff < uVar10)) {
        uVar10 = uVar10 >> 9;
        uVar25 = pTask_pool->m_num_threads + 1;
        if (uVar10 < uVar25) {
          uVar25 = uVar10;
        }
      }
      local_4c8 = 0;
      uStack_4c0 = 0;
      local_4d8 = 0;
      uStack_4d0 = 0;
      local_4e8 = ZEXT816(0);
      local_4f8 = 0;
      uStack_4f0 = 0;
      uVar13 = (ulong)pvVar31->m_begin;
      if (pvVar31->m_begin < pvVar31->m_end) {
        fVar34 = -1.0;
        do {
          pvVar22 = this->m_vectors + (this->m_vectorsInfo).m_p[uVar13].index;
          fVar33 = 0.0;
          lVar15 = 0;
          do {
            fVar35 = pvVar22->m_s[lVar15] - (pvVar31->m_centroid).m_s[lVar15];
            fVar33 = fVar33 + fVar35 * fVar35;
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0x10);
          if (fVar34 < fVar33) {
            local_4c8 = *(undefined8 *)(pvVar22->m_s + 0xc);
            uStack_4c0 = *(undefined8 *)(pvVar22->m_s + 0xe);
            local_4d8 = *(undefined8 *)(pvVar22->m_s + 8);
            uStack_4d0 = *(undefined8 *)(pvVar22->m_s + 10);
            local_4e8 = *(undefined1 (*) [16])(pvVar22->m_s + 4);
            local_4f8 = *(undefined8 *)pvVar22->m_s;
            uStack_4f0 = *(undefined8 *)(pvVar22->m_s + 2);
            fVar34 = fVar33;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != pvVar31->m_end);
      }
      uVar13 = (ulong)pvVar31->m_begin;
      if (pvVar31->m_begin < pvVar31->m_end) {
        fVar34 = -1.0;
        do {
          pvVar22 = this->m_vectors + (this->m_vectorsInfo).m_p[uVar13].index;
          fVar33 = 0.0;
          lVar15 = 0;
          do {
            fVar35 = pvVar22->m_s[lVar15] - *(float *)((long)&local_4f8 + lVar15 * 4);
            fVar33 = fVar33 + fVar35 * fVar35;
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0x10);
          if (fVar34 < fVar33) {
            local_448 = *(undefined8 *)(pvVar22->m_s + 0xc);
            uStack_440 = *(undefined8 *)(pvVar22->m_s + 0xe);
            local_458 = *(undefined8 *)(pvVar22->m_s + 8);
            uStack_450 = *(undefined8 *)(pvVar22->m_s + 10);
            local_468 = *(undefined1 (*) [16])(pvVar22->m_s + 4);
            local_478 = *(undefined8 *)pvVar22->m_s;
            uStack_470 = *(undefined8 *)(pvVar22->m_s + 2);
            fVar34 = fVar33;
          }
          uVar13 = uVar13 + 1;
        } while (uVar13 != pvVar31->m_end);
      }
      lVar15 = 0;
      do {
        (&local_438.m_index)[lVar15] =
             (uint)(*(float *)((long)&local_4f8 + lVar15 * 4) + (pvVar31->m_centroid).m_s[lVar15]);
        lVar15 = lVar15 + 1;
      } while (lVar15 != 0x10);
      lVar15 = 0;
      do {
        *(float *)(local_588 + lVar15 * 4) = (float)(&local_438.m_index)[lVar15] * 0.5;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 0x10);
      lVar15 = 0;
      do {
        (&local_438.m_index)[lVar15] =
             (uint)(*(float *)((long)&local_478 + lVar15 * 4) + (pvVar31->m_centroid).m_s[lVar15]);
        lVar15 = lVar15 + 1;
      } while (lVar15 != 0x10);
      local_5e0 = end_node;
      local_5d8 = node_queue;
      lVar15 = 0;
      do {
        *(float *)(local_5c8 + lVar15 * 4) = (float)(&local_438.m_index)[lVar15] * 0.5;
        lVar15 = lVar15 + 1;
      } while (lVar15 != 0x10);
      uVar10 = pvVar31->m_begin;
      uVar13 = (ulong)uVar10;
      uVar29 = pvVar31->m_end;
      if (uVar10 + 2 < uVar29) {
        pvVar17 = &local_438;
        memset(pvVar17,0,0x400);
        if (uVar10 < uVar29) {
          pvVar22 = this->m_vectors;
          pVVar5 = (this->m_vectorsInfo).m_p;
          do {
            uVar10 = pVVar5[uVar13].index;
            lVar15 = 0;
            do {
              *(float *)((long)&local_678 + lVar15 * 4) =
                   pvVar22[uVar10].m_s[lVar15] - (pvVar31->m_centroid).m_s[lVar15];
              lVar15 = lVar15 + 1;
            } while (lVar15 != 0x10);
            uVar10 = pVVar5[uVar13].weight;
            lVar15 = 0;
            do {
              *(float *)((long)&local_638 + lVar15 * 4) =
                   *(float *)((long)&local_678 + lVar15 * 4) * (float)uVar10;
              lVar15 = lVar15 + 1;
            } while (lVar15 != 0x10);
            lVar15 = 0;
            ppvVar23 = &local_638;
            pvVar21 = &local_438;
            do {
              fVar34 = *(float *)((long)&local_678 + lVar15 * 4);
              lVar26 = -0x10;
              do {
                (&pvVar21[8].m_index)[lVar26] =
                     (uint)(*(float *)((long)ppvVar23 + lVar26 * 4 + 0x40) * fVar34 +
                           (float)(&pvVar21[8].m_index)[lVar26]);
                lVar26 = lVar26 + 1;
              } while (lVar15 + lVar26 != 0);
              lVar15 = lVar15 + 1;
              pvVar21 = (value_type *)&pvVar21[8].m_variance;
              ppvVar23 = (value_type **)((long)ppvVar23 + 4);
            } while (lVar15 != 0x10);
            uVar13 = uVar13 + 1;
          } while (uVar13 != uVar29);
        }
        uVar13 = pvVar31->m_total_weight;
        lVar15 = 0x400;
        lVar26 = 0;
        do {
          lVar16 = 0;
          pvVar21 = pvVar17;
          do {
            fVar34 = (float)pvVar21->m_index / (float)uVar13;
            pvVar21->m_index = (uint)fVar34;
            *(float *)((long)&pvVar17->m_index + lVar16) = fVar34;
            pvVar21 = (value_type *)&pvVar21->m_variance;
            lVar16 = lVar16 + 0x40;
          } while (lVar15 != lVar16);
          lVar26 = lVar26 + 1;
          pvVar17 = (value_type *)&pvVar17[8].m_variance;
          lVar15 = lVar15 + -0x40;
        } while (lVar26 != 0x10);
        lVar15 = 0;
        do {
          *(undefined4 *)((long)&local_678 + lVar15 * 4) = 0x3f800000;
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x10);
        iVar11 = 0;
        do {
          lVar15 = 0;
          pvVar17 = &local_438;
          fVar34 = 0.0;
          do {
            fVar33 = 0.0;
            lVar26 = 0;
            do {
              fVar33 = fVar33 + *(float *)((long)&local_678 + lVar26 * 4) *
                                (float)(&pvVar17->m_index)[lVar26];
              lVar26 = lVar26 + 1;
            } while (lVar26 != 0x10);
            *(float *)((long)&local_638 + lVar15 * 4) = fVar33;
            fVar35 = fVar33;
            if ((lVar15 != 0) && (fVar35 = fVar34, fVar34 <= fVar33)) {
              fVar35 = fVar33;
            }
            lVar15 = lVar15 + 1;
            pvVar17 = pvVar17 + 8;
            fVar34 = fVar35;
          } while (lVar15 != 0x10);
          if ((fVar35 != 0.0) || (NAN(fVar35))) {
            lVar15 = 0;
            do {
              *(float *)((long)&local_638 + lVar15 * 4) =
                   *(float *)((long)&local_638 + lVar15 * 4) * (1.0 / fVar35);
              lVar15 = lVar15 + 1;
            } while (lVar15 != 0x10);
          }
          local_648 = local_608;
          uStack_640 = uStack_600;
          local_658 = local_618;
          uStack_650 = uStack_610;
          local_678 = local_638;
          pvVar17 = local_678;
          puStack_670 = puStack_630;
          iVar11 = iVar11 + 1;
        } while (iVar11 != 10);
        local_678._0_4_ = SUB84(local_638,0);
        dVar8 = (double)((float)local_678 * (float)local_678);
        lVar15 = 1;
        do {
          fVar34 = *(float *)((long)&local_678 + lVar15 * 4);
          dVar8 = dVar8 + (double)(fVar34 * fVar34);
          lVar15 = lVar15 + 1;
        } while (lVar15 != 0x10);
        local_678 = pvVar17;
        if ((dVar8 != 0.0) || (NAN(dVar8))) {
          if (dVar8 < 0.0) {
            dVar8 = sqrt(dVar8);
          }
          else {
            dVar8 = SQRT(dVar8);
          }
          lVar15 = 0;
          do {
            *(float *)((long)&local_678 + lVar15 * 4) =
                 *(float *)((long)&local_678 + lVar15 * 4) * (float)(1.0 / dVar8);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0x10);
        }
        dVar38 = 0.0;
        local_608 = 0;
        uStack_600 = 0;
        local_618 = 0;
        uStack_610 = 0;
        local_628 = 0;
        uStack_624 = 0;
        uStack_620 = 0;
        uStack_61c = 0;
        local_638 = (value_type *)0x0;
        puStack_630 = (undefined1 *)0x0;
        local_4b8[0xc] = 0.0;
        local_4b8[0xd] = 0.0;
        local_4b8[0xe] = 0.0;
        local_4b8[0xf] = 0.0;
        local_4b8[8] = 0.0;
        local_4b8[9] = 0.0;
        local_4b8[10] = 0.0;
        local_4b8[0xb] = 0.0;
        local_4b8[4] = 0.0;
        local_4b8[5] = 0.0;
        local_4b8[6] = 0.0;
        local_4b8[7] = 0.0;
        local_4b8[0] = 0.0;
        local_4b8[1] = 0.0;
        local_4b8[2] = 0.0;
        local_4b8[3] = 0.0;
        uVar13 = (ulong)pvVar31->m_begin;
        uVar10 = pvVar31->m_end;
        dVar8 = 0.0;
        if (pvVar31->m_begin < uVar10) {
          pVVar5 = (this->m_vectorsInfo).m_p;
          pvVar22 = this->m_vectors;
          pvVar6 = (this->m_weightedVectors).m_p;
          dVar38 = 0.0;
          dVar8 = 0.0;
          do {
            uVar29 = pVVar5[uVar13].weight;
            uVar20 = pVVar5[uVar13].index;
            lVar15 = 0;
            do {
              local_548[lVar15] = pvVar22[uVar20].m_s[lVar15] - (pvVar31->m_centroid).m_s[lVar15];
              lVar15 = lVar15 + 1;
            } while (lVar15 != 0x10);
            fVar34 = local_548[0] * (float)local_678;
            lVar15 = 1;
            do {
              fVar34 = fVar34 + local_548[lVar15] * *(float *)((long)&local_678 + lVar15 * 4);
              lVar15 = lVar15 + 1;
            } while (lVar15 != 0x10);
            lVar15 = 0;
            if (0.0 <= fVar34) {
              do {
                local_4b8[lVar15] = pvVar6[uVar20].m_s[lVar15] + local_4b8[lVar15];
                lVar15 = lVar15 + 1;
              } while (lVar15 != 0x10);
              dVar8 = dVar8 + (double)uVar29;
            }
            else {
              do {
                *(float *)((long)&local_638 + lVar15 * 4) =
                     pvVar6[uVar20].m_s[lVar15] + *(float *)((long)&local_638 + lVar15 * 4);
                lVar15 = lVar15 + 1;
              } while (lVar15 != 0x10);
              dVar38 = dVar38 + (double)uVar29;
            }
            uVar13 = uVar13 + 1;
          } while (uVar13 != uVar10);
        }
        if ((0.0 < dVar38) && (0.0 < dVar8)) {
          lVar15 = 0;
          do {
            local_548[lVar15] = *(float *)((long)&local_638 + lVar15 * 4) * (float)(1.0 / dVar38);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0x10);
          local_588._4_4_ = local_548[1];
          local_588._0_4_ = local_548[0];
          local_588._20_4_ = local_548[5];
          local_588._16_4_ = local_548[4];
          local_588._28_4_ = local_548[7];
          local_588._24_4_ = local_548[6];
          local_588._48_4_ = local_548[0xc];
          local_588._52_4_ = local_548[0xd];
          local_588._56_4_ = local_548[0xe];
          local_588._60_4_ = local_548[0xf];
          local_588._32_4_ = local_548[8];
          local_588._36_4_ = local_548[9];
          local_588._40_4_ = local_548[10];
          local_588._44_4_ = local_548[0xb];
          local_588._8_4_ = local_548[2];
          local_588._12_4_ = local_548[3];
          lVar15 = 0;
          do {
            local_548[lVar15] = local_4b8[lVar15] * (float)(1.0 / dVar8);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0x10);
          local_5c8._4_4_ = local_548[1];
          local_5c8._0_4_ = local_548[0];
          local_5a8._8_4_ = local_548[10];
          local_5a8._12_4_ = local_548[0xb];
          local_5a8._0_4_ = local_548[8];
          local_5a8._4_4_ = local_548[9];
          local_598[0] = local_548[0xc];
          local_598[1] = local_548[0xd];
          afStack_590[0] = local_548[0xe];
          afStack_590[1] = local_548[0xf];
          fStack_5b4 = local_548[5];
          local_5c8._16_4_ = local_548[4];
          fStack_5b0 = local_548[6];
          fStack_5ac = local_548[7];
          local_5c8._8_4_ = local_548[2];
          local_5c8._12_4_ = local_548[3];
        }
      }
      pvVar27 = &this->m_vectorsInfoRight;
      pvVar28 = &this->m_vectorsInfoLeft;
      local_508 = ZEXT816(0x501502f9);
      local_69c = 0.0;
      iVar11 = 0;
      fVar34 = 0.0;
      local_5f0 = pvVar27;
      local_5f8 = pvVar28;
      local_5d0 = pvVar31;
      do {
        uVar10 = pvVar31->m_begin;
        uVar13 = (ulong)uVar10;
        afStack_430[10] = 0.0;
        afStack_430[0xb] = 0.0;
        afStack_430[0xc] = 0.0;
        afStack_430[0xd] = 0.0;
        afStack_430[6] = 0.0;
        afStack_430[7] = 0.0;
        afStack_430[8] = 0.0;
        afStack_430[9] = 0.0;
        afStack_430[2] = 0.0;
        afStack_430[3] = 0.0;
        afStack_430[4] = 0.0;
        afStack_430[5] = 0.0;
        local_438.m_index = 0;
        local_438.m_variance = 0.0;
        afStack_430[0] = 0.0;
        afStack_430[1] = 0.0;
        local_648._0_4_ = 0.0;
        local_648._4_4_ = 0.0;
        uStack_640._0_4_ = 0.0;
        uStack_640._4_4_ = 0.0;
        local_658 = 0;
        uStack_650 = 0;
        local_668 = ZEXT816(0);
        local_678._0_4_ = 0.0;
        local_678._4_4_ = 0.0;
        puStack_670 = (undefined1 *)0x0;
        if (uVar25 < 2) {
          if (uVar10 < pvVar31->m_end) {
            dVar8 = 0.0;
            dVar38 = 0.0;
            uVar19 = 0;
            uVar32 = 0;
            uVar30 = uVar13;
            do {
              pVVar5 = (this->m_vectorsInfo).m_p;
              uVar29 = pVVar5[uVar13].index;
              fVar33 = 0.0;
              lVar15 = 0;
              do {
                fVar35 = *(float *)(local_588 + lVar15 * 4) - this->m_vectors[uVar29].m_s[lVar15];
                fVar33 = fVar33 + fVar35 * fVar35;
                lVar15 = lVar15 + 1;
              } while (lVar15 != 0x10);
              fVar35 = 0.0;
              lVar15 = 0;
              do {
                fVar37 = *(float *)(local_5c8 + lVar15 * 4) - this->m_vectors[uVar29].m_s[lVar15];
                fVar35 = fVar35 + fVar37 * fVar37;
                lVar15 = lVar15 + 1;
              } while (lVar15 != 0x10);
              if (fVar35 <= fVar33) {
                pvVar22 = (this->m_weightedVectors).m_p;
                lVar15 = 0;
                do {
                  *(float *)((long)&local_678 + lVar15 * 4) =
                       pvVar22[uVar29].m_s[lVar15] + *(float *)((long)&local_678 + lVar15 * 4);
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 0x10);
                dVar8 = dVar8 + (this->m_weightedDotProducts).m_p[uVar29];
                uVar19 = uVar19 + pVVar5[uVar13].weight;
                pvVar24 = pvVar27;
                uVar29 = uVar10 + 1;
                uVar20 = uVar10;
              }
              else {
                pvVar22 = (this->m_weightedVectors).m_p;
                lVar15 = 0;
                do {
                  (&local_438.m_index)[lVar15] =
                       (uint)(pvVar22[uVar29].m_s[lVar15] + (float)(&local_438.m_index)[lVar15]);
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 0x10);
                dVar38 = dVar38 + (this->m_weightedDotProducts).m_p[uVar29];
                uVar32 = uVar32 + pVVar5[uVar13].weight;
                uVar20 = (uint)uVar30;
                uVar30 = (ulong)(uVar20 + 1);
                pvVar24 = pvVar28;
                uVar29 = uVar10;
              }
              uVar10 = uVar29;
              uVar29 = (uint)uVar30;
              pvVar24->m_p[uVar20] = pVVar5[uVar13];
              uVar13 = uVar13 + 1;
            } while (uVar13 < pvVar31->m_end);
          }
          else {
            dVar38 = 0.0;
            uVar32 = 0;
            uVar19 = 0;
            dVar8 = 0.0;
            uVar29 = uVar10;
          }
        }
        else {
          local_638 = (value_type *)local_588;
          puStack_630 = local_5c8;
          local_628 = pvVar31->m_begin;
          uStack_624 = pvVar31->m_end;
          uVar18 = 0;
          uStack_620 = uVar25;
          local_5e8 = uVar13;
          do {
            pObj = (executable_task *)crnlib_malloc(0x28);
            pObj->_vptr_executable_task = (_func_int **)&PTR_execute_task_001cea50;
            pObj[1]._vptr_executable_task = (_func_int **)this;
            pObj[2]._vptr_executable_task = (_func_int **)distance_comparison_task;
            pObj[3]._vptr_executable_task = (_func_int **)0x0;
            *(undefined4 *)&pObj[4]._vptr_executable_task = 1;
            task_pool::queue_task(pTask_pool,pObj,uVar18,&local_638);
            uVar18 = uVar18 + 1;
          } while (uVar18 < uStack_620);
          task_pool::join(pTask_pool);
          uVar13 = (ulong)local_5d0->m_begin;
          pvVar27 = local_5f0;
          pvVar28 = local_5f8;
          pvVar31 = local_5d0;
          if (local_5d0->m_begin < local_5d0->m_end) {
            dVar8 = 0.0;
            dVar38 = 0.0;
            uVar14 = local_5e8 & 0xffffffff;
            uVar19 = 0;
            uVar32 = 0;
            uVar30 = local_5e8;
            do {
              pVVar5 = (this->m_vectorsInfo).m_p;
              uVar10 = pVVar5[uVar13].index;
              if ((this->m_vectorComparison).m_p[uVar13] == true) {
                pvVar22 = (this->m_weightedVectors).m_p;
                lVar15 = 0;
                do {
                  (&local_438.m_index)[lVar15] =
                       (uint)(pvVar22[uVar10].m_s[lVar15] + (float)(&local_438.m_index)[lVar15]);
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 0x10);
                dVar38 = dVar38 + (this->m_weightedDotProducts).m_p[uVar10];
                uVar32 = uVar32 + pVVar5[uVar13].weight;
                uVar10 = (uint)uVar30;
                uVar30 = (ulong)(uVar10 + 1);
                pvVar24 = local_5f8;
              }
              else {
                pvVar22 = (this->m_weightedVectors).m_p;
                lVar15 = 0;
                do {
                  *(float *)((long)&local_678 + lVar15 * 4) =
                       pvVar22[uVar10].m_s[lVar15] + *(float *)((long)&local_678 + lVar15 * 4);
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 0x10);
                dVar8 = dVar8 + (this->m_weightedDotProducts).m_p[uVar10];
                uVar19 = uVar19 + pVVar5[uVar13].weight;
                uVar10 = (uint)uVar14;
                uVar14 = (ulong)(uVar10 + 1);
                pvVar24 = local_5f0;
              }
              uVar29 = (uint)uVar30;
              pvVar24->m_p[uVar10] = pVVar5[uVar13];
              uVar13 = uVar13 + 1;
            } while (uVar13 < local_5d0->m_end);
          }
          else {
            dVar38 = 0.0;
            uVar32 = 0;
            uVar19 = 0;
            dVar8 = 0.0;
            uVar29 = (uint)local_5e8;
          }
        }
        this_00 = local_5d8;
        if ((uVar32 == 0) || (uVar19 == 0)) {
          pvVar31->m_unsplittable = true;
          iVar12 = 1;
        }
        else {
          fVar34 = (float)local_438.m_index * (float)local_438.m_index;
          lVar15 = 1;
          do {
            fVar34 = fVar34 + (float)(&local_438.m_index)[lVar15] *
                              (float)(&local_438.m_index)[lVar15];
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0x10);
          fVar33 = (float)local_678 * (float)local_678;
          lVar15 = 1;
          do {
            fVar35 = *(float *)((long)&local_678 + lVar15 * 4);
            fVar33 = fVar33 + fVar35 * fVar35;
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0x10);
          lVar15 = 0;
          do {
            (&local_438.m_index)[lVar15] =
                 (uint)((float)(&local_438.m_index)[lVar15] * (1.0 / (float)uVar32));
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0x10);
          fVar34 = (float)(dVar38 - (double)(fVar34 / (float)uVar32));
          lVar15 = 0;
          do {
            *(float *)((long)&local_678 + lVar15 * 4) =
                 *(float *)((long)&local_678 + lVar15 * 4) * (1.0 / (float)uVar19);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0x10);
          local_588._48_4_ = afStack_430[10];
          local_588._52_4_ = afStack_430[0xb];
          local_588._56_4_ = afStack_430[0xc];
          local_588._60_4_ = afStack_430[0xd];
          local_588._32_4_ = afStack_430[6];
          local_588._36_4_ = afStack_430[7];
          local_588._40_4_ = afStack_430[8];
          local_588._44_4_ = afStack_430[9];
          local_588._16_4_ = afStack_430[2];
          local_588._20_4_ = afStack_430[3];
          local_588._24_4_ = afStack_430[4];
          local_588._28_4_ = afStack_430[5];
          local_588._0_4_ = local_438.m_index;
          local_588._4_4_ = local_438.m_variance;
          local_588._8_4_ = afStack_430[0];
          local_588._12_4_ = afStack_430[1];
          local_5c8._0_4_ = (float)local_678;
          local_5c8._4_4_ = local_678._4_4_;
          local_5c8._8_8_ = puStack_670;
          stack0xfffffffffffffa48 = local_668;
          local_5a8._8_8_ = uStack_650;
          local_5a8._0_8_ = local_658;
          local_598[0] = (float)local_648;
          local_598[1] = local_648._4_4_;
          afStack_590[0] = (float)uStack_640;
          afStack_590[1] = uStack_640._4_4_;
          local_69c = (float)(dVar8 - (double)(fVar33 / (float)uVar19));
          fVar33 = fVar34 + local_69c;
          iVar12 = 0x23;
          if (1e-05 <= fVar33) {
            fVar35 = ((float)local_508._0_4_ - fVar33) / fVar33;
            uVar10 = -(uint)(fVar35 < 1e-05);
            auVar36._0_4_ = local_508._0_4_ & uVar10;
            auVar36._4_4_ = local_508._4_4_;
            auVar36._8_4_ = local_508._8_4_;
            auVar36._12_4_ = local_508._12_4_;
            local_508 = auVar36 | ZEXT416(~uVar10 & (uint)fVar33);
            iVar12 = 0;
            if (fVar35 < 1e-05) {
              iVar12 = 0x23;
            }
          }
        }
        if (iVar12 != 0) goto LAB_001870d2;
        iVar11 = iVar11 + 1;
      } while (iVar11 != 0x400);
      iVar12 = 0x23;
LAB_001870d2:
      if (iVar12 == 0x23) {
        uVar2 = *local_5e0;
        *local_5e0 = uVar2 + 1;
        pvVar31->m_left = uVar2;
        uVar2 = *local_5e0;
        *local_5e0 = uVar2 + 1;
        pvVar31->m_right = uVar2;
        local_438.m_variance = fVar34;
        local_438.m_index = pvVar31->m_left;
        std::
        priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
        ::push(local_5d8,&local_438);
        local_438.m_variance = local_69c;
        local_438.m_index = pvVar31->m_right;
        std::
        priority_queue<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::vector<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo,_std::allocator<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>,_std::less<crnlib::tree_clusterizer<crnlib::vec<16U,_float>_>::NodeInfo>_>
        ::push(this_00,&local_438);
        uVar25 = pvVar31->m_left;
        pvVar7 = (this->m_nodes).m_p;
        pvVar4 = pvVar7 + uVar25;
        uVar10 = pvVar31->m_right;
        pvVar1 = pvVar7 + uVar10;
        pvVar7[uVar25].m_begin = pvVar31->m_begin;
        pvVar7[uVar10].m_begin = uVar29;
        pvVar7[uVar25].m_end = uVar29;
        pvVar7[uVar10].m_end = pvVar31->m_end;
        memcpy((this->m_vectorsInfo).m_p + pvVar7[uVar25].m_begin,
               (this->m_vectorsInfoLeft).m_p + pvVar31->m_begin,
               (ulong)(pvVar7[uVar25].m_end - pvVar7[uVar25].m_begin) << 3);
        memcpy((this->m_vectorsInfo).m_p + pvVar7[uVar10].m_begin,
               (this->m_vectorsInfoRight).m_p + pvVar31->m_begin,
               (ulong)(pvVar7[uVar10].m_end - pvVar7[uVar10].m_begin) << 3);
        if (pvVar4 != (vq_node *)local_588) {
          lVar15 = 0;
          do {
            (pvVar4->m_centroid).m_s[lVar15] = *(float *)(local_588 + lVar15 * 4);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0x10);
        }
        pvVar4->m_total_weight = uVar32;
        pvVar4->m_variance = fVar34;
        if (pvVar1 != (vq_node *)local_5c8) {
          lVar15 = 0;
          do {
            (pvVar1->m_centroid).m_s[lVar15] = *(float *)(local_5c8 + lVar15 * 4);
            lVar15 = lVar15 + 1;
          } while (lVar15 != 0x10);
        }
        pvVar1->m_total_weight = uVar19;
        pvVar1->m_variance = local_69c;
      }
      return true;
    }
  }
  return false;
}

Assistant:

bool split_node(std::priority_queue<NodeInfo>& node_queue, uint& end_node, task_pool* pTask_pool = 0)
        {
            if (node_queue.empty())
            {
                return false;
            }

            vq_node& parent_node = m_nodes[node_queue.top().m_index];

            if (parent_node.m_alternative)
            {
                parent_node.m_alternative = false;
            }

            if (parent_node.m_variance <= 0.0f || parent_node.m_begin + 1 == parent_node.m_end)
            {
                return false;
            }

            node_queue.pop();

            if (parent_node.m_processed)
            {
                if (!parent_node.m_unsplittable)
                {
                    m_nodes[end_node] = m_nodes[parent_node.m_left];
                    m_nodes[end_node].m_alternative = true;
                    node_queue.push(NodeInfo(end_node, m_nodes[end_node].m_variance));
                    parent_node.m_left = end_node++;
                    m_nodes[end_node] = m_nodes[parent_node.m_right];
                    m_nodes[end_node].m_alternative = true;
                    node_queue.push(NodeInfo(end_node, m_nodes[end_node].m_variance));
                    parent_node.m_right = end_node++;
                }
                return true;
            }
            parent_node.m_processed = true;

            uint num_blocks = (parent_node.m_end - parent_node.m_begin) >> 9;
            uint num_tasks = num_blocks > 1 && pTask_pool ? math::minimum(num_blocks, pTask_pool->get_num_threads() + 1) : 1;

            VectorType furthest(0);
            double furthest_dist = -1.0f;

            for (uint i = parent_node.m_begin; i < parent_node.m_end; i++)
            {
                const VectorType& v = m_vectors[m_vectorsInfo[i].index];
                double dist = v.squared_distance(parent_node.m_centroid);
                if (dist > furthest_dist)
                {
                    furthest_dist = dist;
                    furthest = v;
                }
            }

            VectorType opposite;
            double opposite_dist = -1.0f;

            for (uint i = parent_node.m_begin; i < parent_node.m_end; i++)
            {
                const VectorType& v = m_vectors[m_vectorsInfo[i].index];
                double dist = v.squared_distance(furthest);
                if (dist > opposite_dist)
                {
                    opposite_dist = dist;
                    opposite = v;
                }
            }

            VectorType left_child((furthest + parent_node.m_centroid) * .5f);
            VectorType right_child((opposite + parent_node.m_centroid) * .5f);

            if (parent_node.m_begin + 2 < parent_node.m_end)
            {
                const uint N = VectorType::num_elements;

                matrix<N, N, float> covar;
                covar.clear();

                for (uint i = parent_node.m_begin; i < parent_node.m_end; i++)
                {
                    const VectorType& v = m_vectors[m_vectorsInfo[i].index] - parent_node.m_centroid;
                    const VectorType w = v * (float)m_vectorsInfo[i].weight;
                    for (uint x = 0; x < N; x++)
                    {
                        for (uint y = x; y < N; y++)
                        {
                            covar[x][y] = covar[x][y] + v[x] * w[y];
                        }
                    }
                }

                float divider = (float)parent_node.m_total_weight;
                for (uint x = 0; x < N; x++)
                {
                    for (uint y = x; y < N; y++)
                    {
                        covar[x][y] /= divider;
                        covar[y][x] = covar[x][y];
                    }
                }

                VectorType axis(1.0f);
                // Starting with an estimate of the principle axis should work better, but doesn't in practice?
                //left_child - right_child);
                //axis.normalize();

                for (uint iter = 0; iter < 10; iter++)
                {
                    VectorType x;

                    double max_sum = 0;

                    for (uint i = 0; i < N; i++)
                    {
                        double sum = 0;

                        for (uint j = 0; j < N; j++)
                        {
                            sum += axis[j] * covar[i][j];
                        }

                        x[i] = (float)sum;

                        max_sum = i ? math::maximum(max_sum, sum) : sum;
                    }

                    if (max_sum != 0.0f)
                    {
                        x *= (float)(1.0f / max_sum);
                    }

                    axis = x;
                }

                axis.normalize();

                VectorType new_left_child(0.0f);
                VectorType new_right_child(0.0f);

                double left_weight = 0.0f;
                double right_weight = 0.0f;

                for (uint i = parent_node.m_begin; i < parent_node.m_end; i++)
                {
                    const VectorInfo& vectorInfo = m_vectorsInfo[i];
                    const float weight = (float)vectorInfo.weight;
                    double t = (m_vectors[vectorInfo.index] - parent_node.m_centroid) * axis;
                    if (t < 0.0f)
                    {
                        new_left_child += m_weightedVectors[vectorInfo.index];
                        left_weight += weight;
                    }
                    else
                    {
                        new_right_child += m_weightedVectors[vectorInfo.index];
                        right_weight += weight;
                    }
                }

                if ((left_weight > 0.0f) && (right_weight > 0.0f))
                {
                    left_child = new_left_child * (float)(1.0f / left_weight);
                    right_child = new_right_child * (float)(1.0f / right_weight);
                }
            }

            uint64 left_weight = 0;
            uint64 right_weight = 0;

            uint left_info_index = 0;
            uint right_info_index = 0;

            float prev_total_variance = 1e+10f;

            float left_variance = 0.0f;
            float right_variance = 0.0f;

            // FIXME: Excessive upper limit
            const uint cMaxLoops = 1024;
            for (uint total_loops = 0; total_loops < cMaxLoops; total_loops++)
            {
                left_info_index = right_info_index = parent_node.m_begin;

                VectorType new_left_child(cClear);
                VectorType new_right_child(cClear);

                double left_ttsum = 0.0f;
                double right_ttsum = 0.0f;

                left_weight = 0;
                right_weight = 0;

                if (num_tasks > 1)
                {
                    distance_comparison_task_params params;
                    params.left_child = &left_child;
                    params.right_child = &right_child;
                    params.begin = parent_node.m_begin;
                    params.end = parent_node.m_end;
                    params.num_tasks = num_tasks;

                    for (uint task = 0; task < params.num_tasks; task++)
                    {
                        pTask_pool->queue_object_task(this, &tree_clusterizer::distance_comparison_task, task, &params);
                    }
                    pTask_pool->join();

                    for (uint i = parent_node.m_begin; i < parent_node.m_end; i++)
                    {
                        const VectorInfo& vectorInfo = m_vectorsInfo[i];
                        if (m_vectorComparison[i])
                        {
                            new_left_child += m_weightedVectors[vectorInfo.index];
                            left_ttsum += m_weightedDotProducts[vectorInfo.index];
                            left_weight += vectorInfo.weight;
                            m_vectorsInfoLeft[left_info_index++] = vectorInfo;
                        }
                        else
                        {
                            new_right_child += m_weightedVectors[vectorInfo.index];
                            right_ttsum += m_weightedDotProducts[vectorInfo.index];
                            right_weight += vectorInfo.weight;
                            m_vectorsInfoRight[right_info_index++] = vectorInfo;
                        }
                    }
                }
                else
                {
                    for (uint i = parent_node.m_begin; i < parent_node.m_end; i++)
                    {
                        const VectorInfo& vectorInfo = m_vectorsInfo[i];
                        double left_dist2 = left_child.squared_distance(m_vectors[vectorInfo.index]);
                        double right_dist2 = right_child.squared_distance(m_vectors[vectorInfo.index]);
                        if (left_dist2 < right_dist2)
                        {
                            new_left_child += m_weightedVectors[vectorInfo.index];
                            left_ttsum += m_weightedDotProducts[vectorInfo.index];
                            left_weight += vectorInfo.weight;
                            m_vectorsInfoLeft[left_info_index++] = vectorInfo;
                        }
                        else
                        {
                            new_right_child += m_weightedVectors[vectorInfo.index];
                            right_ttsum += m_weightedDotProducts[vectorInfo.index];
                            right_weight += vectorInfo.weight;
                            m_vectorsInfoRight[right_info_index++] = vectorInfo;
                        }
                    }
                }

                if ((!left_weight) || (!right_weight))
                {
                    parent_node.m_unsplittable = true;
                    return true;
                }

                left_variance = (float)(left_ttsum - (new_left_child.dot(new_left_child) / left_weight));
                right_variance = (float)(right_ttsum - (new_right_child.dot(new_right_child) / right_weight));

                new_left_child *= (1.0f / left_weight);
                new_right_child *= (1.0f / right_weight);

                left_child = new_left_child;
                right_child = new_right_child;

                float total_variance = left_variance + right_variance;
                if (total_variance < .00001f)
                {
                    break;
                }

                if (((prev_total_variance - total_variance) / total_variance) < .00001f)
                {
                    break;
                }

                prev_total_variance = total_variance;
            }

            parent_node.m_left = end_node++;
            parent_node.m_right = end_node++;

            node_queue.push(NodeInfo(parent_node.m_left, left_variance));
            node_queue.push(NodeInfo(parent_node.m_right, right_variance));

            vq_node& left_child_node = m_nodes[parent_node.m_left];
            vq_node& right_child_node = m_nodes[parent_node.m_right];

            left_child_node.m_begin = parent_node.m_begin;
            left_child_node.m_end = right_child_node.m_begin = left_info_index;
            right_child_node.m_end = parent_node.m_end;

            memcpy(&m_vectorsInfo[left_child_node.m_begin], &m_vectorsInfoLeft[parent_node.m_begin], (left_child_node.m_end - left_child_node.m_begin) * sizeof(VectorInfo));
            memcpy(&m_vectorsInfo[right_child_node.m_begin], &m_vectorsInfoRight[parent_node.m_begin], (right_child_node.m_end - right_child_node.m_begin) * sizeof(VectorInfo));

            left_child_node.m_centroid = left_child;
            left_child_node.m_total_weight = left_weight;
            left_child_node.m_variance = left_variance;

            right_child_node.m_centroid = right_child;
            right_child_node.m_total_weight = right_weight;
            right_child_node.m_variance = right_variance;

            return true;
        }